

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

uint16_t __thiscall CConnman::GetDefaultPort(CConnman *this,string *addr)

{
  bool bVar1;
  Network NVar2;
  uint16_t uVar3;
  long in_FS_OFFSET;
  CNetAddr a;
  direct_or_indirect local_40;
  uint local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)&local_40.indirect_contents);
  bVar1 = CNetAddr::SetSpecial((CNetAddr *)&local_40.indirect_contents,addr);
  if (bVar1) {
    NVar2 = CNetAddr::GetNetwork((CNetAddr *)&local_40.indirect_contents);
    if (NVar2 == NET_I2P) {
      uVar3 = 0;
      goto LAB_001a00e4;
    }
  }
  uVar3 = this->m_params->nDefaultPort;
LAB_001a00e4:
  if (0x10 < local_30) {
    free(local_40.indirect_contents.indirect);
    local_40.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint16_t CConnman::GetDefaultPort(const std::string& addr) const
{
    CNetAddr a;
    return a.SetSpecial(addr) ? GetDefaultPort(a.GetNetwork()) : m_params.GetDefaultPort();
}